

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET hal_h264e_vepu580_wait(void *hal,HalEncTask *task)

{
  MppPacket s;
  long lVar1;
  RK_S32 type_00;
  uint len;
  MPP_RET MVar2;
  HalVepu580RegSet *regs_00;
  size_t sVar3;
  undefined4 *param_00;
  HalH264eVepuStreamAmend *ctx_00;
  undefined4 local_8c;
  HalH264eVepuStreamAmend *amend;
  MppDevPollCfg *poll_cfg;
  RK_U32 slice_last;
  RK_U32 slice_len;
  EncOutParam param;
  RK_S32 i;
  MppEncH264HwCfg *hw_cfg;
  H264NaluType type;
  RK_S32 offset;
  MppPacket pkt;
  RK_U32 split_out;
  HalVepu580RegSet *regs;
  HalH264eVepu580Ctx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  regs_00 = (HalVepu580RegSet *)
            (*(long *)((long)hal + 0x1a0) + (long)(task->flags).reg_idx * 0x1cb8);
  pkt._4_4_ = *(uint *)(*hal + 0xe9c);
  s = task->packet;
  sVar3 = mpp_packet_get_length(s);
  hw_cfg._4_4_ = (int)sVar3;
  type_00 = 1;
  if (((task->rc_task->frm).val >> 5 & 1) != 0) {
    type_00 = 5;
  }
  lVar1 = *hal;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_wait",hal);
  }
  if (((task->rc_task->frm).val >> 2 & 1) != 0) {
    pkt._4_4_ = 0;
  }
  *(uint *)(lVar1 + 0x368) = pkt._4_4_;
  if (pkt._4_4_ == 0) {
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
    if (MVar2 == MPP_OK) {
      ctx._4_4_ = hal_h264e_vepu580_status_check(regs_00);
      if (ctx._4_4_ == MPP_OK) {
        task->hw_length = (regs_00->reg_st).bs_lgth_l32 + task->hw_length;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu580","poll cmd failed %d\n","hal_h264e_vepu580_wait",
                 (ulong)(uint)MVar2);
      ctx._4_4_ = MPP_ERR_VPUHW;
    }
    mpp_packet_add_segment_info(s,type_00,hw_cfg._4_4_,(regs_00->reg_st).bs_lgth_l32);
  }
  else {
    param_00 = (undefined4 *)
               (*(long *)((long)hal + 0x208) +
               (long)((task->flags).reg_idx * *(int *)((long)hal + 0x204)));
    _slice_last = task;
    param.task = mpp_packet_get_data(task->packet);
    do {
      *param_00 = 0;
      param_00[1] = 0;
      if ((pkt._4_4_ & 1) == 0) {
        local_8c = *(undefined4 *)((long)hal + 0x200);
      }
      else {
        local_8c = 1;
      }
      param_00[2] = local_8c;
      param_00[3] = 0;
      mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,param_00);
      for (param.length = 0; param.length < (int)param_00[3]; param.length = param.length + 1) {
        poll_cfg._0_4_ = -((int)param_00[(long)param.length + 4] >> 0x1f);
        len = param_00[(long)param.length + 4] & 0x7fffffff;
        mpp_packet_add_segment_info(s,type_00,hw_cfg._4_4_,len);
        hw_cfg._4_4_ = len + hw_cfg._4_4_;
        if ((pkt._4_4_ & 1) != 0) {
          if ((int)poll_cfg == 0) {
            *(undefined4 *)(*(long *)((long)hal + 0x1f8) + 0x10) = 0x202;
          }
          else {
            *(undefined4 *)(*(long *)((long)hal + 0x1f8) + 0x10) = 0x201;
          }
          param.base._4_4_ = len;
          mpp_callback_f("hal_h264e_vepu580_wait",*(MppCbCtx **)((long)hal + 0x1f8),&slice_last);
        }
      }
    } while ((int)poll_cfg == 0);
    ctx._4_4_ = hal_h264e_vepu580_status_check(regs_00);
    if (ctx._4_4_ == MPP_OK) {
      task->hw_length = (regs_00->reg_st).bs_lgth_l32 + task->hw_length;
    }
  }
  if (((pkt._4_4_ & 1) == 0) && (ctx._4_4_ == MPP_OK)) {
    ctx_00 = (HalH264eVepuStreamAmend *)
             (*(long *)((long)hal + 0x1a8) + (long)(task->flags).reg_idx * 0x60);
    if (ctx_00->enable == 0) {
      if (ctx_00->prefix != (H264ePrefixNal *)0x0) {
        ctx_00->old_length = task->hw_length;
        h264e_vepu_stream_amend_sync_ref_idc(ctx_00);
      }
    }
    else {
      ctx_00->old_length = task->hw_length;
      ctx_00->slice->is_multi_slice = (uint)(*(int *)(*hal + 0xe94) != 0);
      h264e_vepu_stream_amend_proc(ctx_00,(MppEncH264HwCfg *)(*hal + 0x360));
      task->hw_length = ctx_00->new_length;
    }
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p ret %d\n","hal_h264e_vepu580_wait",hal,
               (ulong)(uint)ctx._4_4_);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu580_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    HalVepu580RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    RK_U32 split_out = ctx->cfg->split.split_out;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppEncH264HwCfg *hw_cfg = &ctx->cfg->codec.h264.hw_cfg;
    RK_S32 i;

    hal_h264e_dbg_func("enter %p\n", hal);

    /* if pass1 mode, it will disable split mode and the split out need to be disable */
    if (task->rc_task->frm.save_pass1)
        split_out = 0;

    /* update split_out in hw_cfg */
    hw_cfg->hw_split_out = split_out;

    if (split_out) {
        EncOutParam param;
        RK_U32 slice_len;
        RK_U32 slice_last;
        MppDevPollCfg *poll_cfg = (MppDevPollCfg *)((char *)ctx->poll_cfgs +
                                                    task->flags.reg_idx * ctx->poll_cfg_size);
        param.task = task;
        param.base = mpp_packet_get_data(task->packet);

        do {
            poll_cfg->poll_type = 0;
            poll_cfg->poll_ret  = 0;
            poll_cfg->count_max = split_out & MPP_ENC_SPLIT_OUT_LOWDELAY ? 1 : ctx->poll_slice_max;
            poll_cfg->count_ret = 0;

            ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, poll_cfg);

            for (i = 0; i < poll_cfg->count_ret; i++) {
                slice_last = poll_cfg->slice_info[i].last;
                slice_len = poll_cfg->slice_info[i].length;

                mpp_packet_add_segment_info(pkt, type, offset, slice_len);
                offset += slice_len;

                if (split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) {
                    param.length = slice_len;

                    if (slice_last)
                        ctx->output_cb->cmd = ENC_OUTPUT_FINISH;
                    else
                        ctx->output_cb->cmd = ENC_OUTPUT_SLICE;

                    mpp_callback(ctx->output_cb, &param);
                }
            }
        } while (!slice_last);

        ret = hal_h264e_vepu580_status_check(regs);
        if (!ret)
            task->hw_length += regs->reg_st.bs_lgth_l32;
    } else {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret) {
            mpp_err_f("poll cmd failed %d\n", ret);
            ret = MPP_ERR_VPUHW;
        } else {
            ret = hal_h264e_vepu580_status_check(regs);
            if (!ret)
                task->hw_length += regs->reg_st.bs_lgth_l32;
        }

        mpp_packet_add_segment_info(pkt, type, offset, regs->reg_st.bs_lgth_l32);
    }

    if (!(split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) && !ret) {
        HalH264eVepuStreamAmend *amend = &ctx->amend_sets[task->flags.reg_idx];

        if (amend->enable) {
            amend->old_length = task->hw_length;
            amend->slice->is_multi_slice = (ctx->cfg->split.split_mode > 0);
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            task->hw_length = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = task->hw_length;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }

    hal_h264e_dbg_func("leave %p ret %d\n", hal, ret);

    return ret;
}